

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  byte bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined4 uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined4 uVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined4 uVar83;
  undefined1 auVar84 [16];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar85 [64];
  undefined1 auVar51 [32];
  
  fVar11 = scale * r_scale0;
  pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = pBVar6[itime].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[itime].super_RawBufferView.stride;
  lVar30 = (uVar5 + 1) * sVar8;
  lVar29 = (uVar5 + 2) * sVar8;
  lVar28 = (uVar5 + 3) * sVar8;
  aVar2 = ofs->field_0;
  auVar35 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + uVar5 * sVar8),(undefined1  [16])aVar2);
  auVar39._0_4_ = scale * auVar35._0_4_;
  auVar39._4_4_ = scale * auVar35._4_4_;
  auVar39._8_4_ = scale * auVar35._8_4_;
  auVar39._12_4_ = scale * auVar35._12_4_;
  auVar36._4_4_ = auVar39._0_4_;
  auVar36._0_4_ = auVar39._0_4_;
  auVar36._8_4_ = auVar39._0_4_;
  auVar36._12_4_ = auVar39._0_4_;
  auVar35 = vshufps_avx(auVar39,auVar39,0x55);
  aVar3 = (space->vx).field_0;
  auVar31 = vshufps_avx(auVar39,auVar39,0xaa);
  aVar4 = (space->vy).field_0;
  fVar22 = (space->vz).field_0.m128[0];
  fVar23 = (space->vz).field_0.m128[1];
  fVar24 = (space->vz).field_0.m128[2];
  fVar25 = (space->vz).field_0.m128[3];
  auVar40._0_4_ = fVar22 * auVar31._0_4_;
  auVar40._4_4_ = fVar23 * auVar31._4_4_;
  auVar40._8_4_ = fVar24 * auVar31._8_4_;
  auVar40._12_4_ = fVar25 * auVar31._12_4_;
  auVar35 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar4,auVar35);
  auVar39 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar36);
  fVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar12 = fVar11 * fVar1 * *(float *)(pcVar7 + uVar5 * sVar8 + 0xc);
  auVar35 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar30),(undefined1  [16])aVar2);
  auVar69._0_4_ = scale * auVar35._0_4_;
  auVar69._4_4_ = scale * auVar35._4_4_;
  auVar69._8_4_ = scale * auVar35._8_4_;
  auVar69._12_4_ = scale * auVar35._12_4_;
  auVar34._4_4_ = auVar69._0_4_;
  auVar34._0_4_ = auVar69._0_4_;
  auVar34._8_4_ = auVar69._0_4_;
  auVar34._12_4_ = auVar69._0_4_;
  auVar35 = vshufps_avx(auVar69,auVar69,0x55);
  auVar31 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar33._0_4_ = fVar22 * auVar31._0_4_;
  auVar33._4_4_ = fVar23 * auVar31._4_4_;
  auVar33._8_4_ = fVar24 * auVar31._8_4_;
  auVar33._12_4_ = fVar25 * auVar31._12_4_;
  auVar35 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar4,auVar35);
  auVar40 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar34);
  fVar13 = fVar11 * fVar1 * *(float *)(pcVar7 + lVar30 + 0xc);
  auVar35 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar29),(undefined1  [16])aVar2);
  auVar38._0_4_ = scale * auVar35._0_4_;
  auVar38._4_4_ = scale * auVar35._4_4_;
  auVar38._8_4_ = scale * auVar35._8_4_;
  auVar38._12_4_ = scale * auVar35._12_4_;
  auVar32._4_4_ = auVar38._0_4_;
  auVar32._0_4_ = auVar38._0_4_;
  auVar32._8_4_ = auVar38._0_4_;
  auVar32._12_4_ = auVar38._0_4_;
  auVar35 = vshufps_avx(auVar38,auVar38,0x55);
  auVar31 = vshufps_avx(auVar38,auVar38,0xaa);
  auVar78._0_4_ = fVar22 * auVar31._0_4_;
  auVar78._4_4_ = fVar23 * auVar31._4_4_;
  auVar78._8_4_ = fVar24 * auVar31._8_4_;
  auVar78._12_4_ = fVar25 * auVar31._12_4_;
  auVar35 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar35);
  auVar36 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar32);
  fVar14 = fVar11 * fVar1 * *(float *)(pcVar7 + lVar29 + 0xc);
  auVar35 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar28),(undefined1  [16])aVar2);
  auVar31._0_4_ = scale * auVar35._0_4_;
  auVar31._4_4_ = scale * auVar35._4_4_;
  auVar31._8_4_ = scale * auVar35._8_4_;
  auVar31._12_4_ = scale * auVar35._12_4_;
  auVar37._4_4_ = auVar31._0_4_;
  auVar37._0_4_ = auVar31._0_4_;
  auVar37._8_4_ = auVar31._0_4_;
  auVar37._12_4_ = auVar31._0_4_;
  auVar35 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar84._0_4_ = fVar22 * auVar31._0_4_;
  auVar84._4_4_ = fVar23 * auVar31._4_4_;
  auVar84._8_4_ = fVar24 * auVar31._8_4_;
  auVar84._12_4_ = fVar25 * auVar31._12_4_;
  auVar35 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar35);
  auVar35 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar37);
  auVar31 = vmulss_avx512f(ZEXT416((uint)fVar11),
                           ZEXT416((uint)(fVar1 * *(float *)(pcVar7 + lVar28 + 0xc))));
  uVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          tessellationRate;
  uVar26 = (ulong)uVar5;
  uVar77 = auVar36._0_4_;
  uVar66 = auVar39._0_4_;
  uVar83 = auVar40._0_4_;
  if (uVar26 == 4) {
    auVar61._4_4_ = fVar14;
    auVar61._0_4_ = fVar14;
    auVar61._8_4_ = fVar14;
    auVar61._12_4_ = fVar14;
    auVar69 = vblendps_avx(auVar36,auVar61,8);
    auVar70._4_4_ = uVar66;
    auVar70._0_4_ = uVar66;
    auVar70._8_4_ = uVar66;
    auVar70._12_4_ = uVar66;
    auVar38 = vshufps_avx(auVar39,auVar39,0x55);
    auVar39 = vshufps_avx(auVar39,auVar39,0xaa);
    auVar67._4_4_ = fVar12;
    auVar67._0_4_ = fVar12;
    auVar67._8_4_ = fVar12;
    auVar67._12_4_ = fVar12;
    auVar76._4_4_ = uVar83;
    auVar76._0_4_ = uVar83;
    auVar76._8_4_ = uVar83;
    auVar76._12_4_ = uVar83;
    auVar37 = vshufps_avx(auVar40,auVar40,0x55);
    auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
    auVar73._4_4_ = fVar13;
    auVar73._0_4_ = fVar13;
    auVar73._8_4_ = fVar13;
    auVar73._12_4_ = fVar13;
    auVar81._4_4_ = uVar77;
    auVar81._0_4_ = uVar77;
    auVar81._8_4_ = uVar77;
    auVar81._12_4_ = uVar77;
    auVar32 = vshufps_avx512vl(auVar36,auVar36,0x55);
    auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
    auVar33 = vbroadcastss_avx512vl(auVar35);
    auVar34 = vshufps_avx512vl(auVar35,auVar35,0x55);
    auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
    auVar31 = vbroadcastss_avx512vl(auVar31);
    auVar33 = vmulps_avx512vl(auVar33,catmullrom_basis0._3740_16_);
    auVar34 = vmulps_avx512vl(auVar34,catmullrom_basis0._3740_16_);
    auVar35 = vmulps_avx512vl(auVar35,catmullrom_basis0._3740_16_);
    auVar31 = vmulps_avx512vl(auVar31,catmullrom_basis0._3740_16_);
    auVar33 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._2584_16_,auVar81);
    auVar32 = vfmadd231ps_avx512vl(auVar34,catmullrom_basis0._2584_16_,auVar32);
    auVar35 = vfmadd231ps_fma(auVar35,catmullrom_basis0._2584_16_,auVar36);
    auVar31 = vfmadd231ps_avx512vl(auVar31,auVar61,catmullrom_basis0._2584_16_);
    auVar36 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._1428_16_,auVar76);
    auVar37 = vfmadd231ps_avx512vl(auVar32,catmullrom_basis0._1428_16_,auVar37);
    auVar35 = vfmadd231ps_fma(auVar35,catmullrom_basis0._1428_16_,auVar40);
    auVar31 = vfmadd231ps_avx512vl(auVar31,catmullrom_basis0._1428_16_,auVar73);
    auVar32 = vfmadd231ps_avx512vl(auVar36,catmullrom_basis0._272_16_,auVar70);
    auVar38 = vfmadd231ps_avx512vl(auVar37,catmullrom_basis0._272_16_,auVar38);
    auVar36 = vfmadd231ps_fma(auVar35,catmullrom_basis0._272_16_,auVar39);
    auVar37 = vfmadd231ps_avx512vl(auVar31,catmullrom_basis0._272_16_,auVar67);
    auVar33 = vshufps_avx512vl(auVar32,auVar32,0xb1);
    auVar31 = vminps_avx512vl(auVar33,auVar32);
    auVar35 = vshufpd_avx(auVar31,auVar31,1);
    auVar35 = vminps_avx(auVar35,auVar31);
    auVar34 = vshufps_avx512vl(auVar38,auVar38,0xb1);
    auVar39 = vminps_avx512vl(auVar34,auVar38);
    auVar31 = vshufpd_avx(auVar39,auVar39,1);
    auVar31 = vminps_avx(auVar31,auVar39);
    auVar35 = vinsertps_avx(auVar35,auVar31,0x1c);
    auVar40 = vshufps_avx(auVar36,auVar36,0xb1);
    auVar31 = vminps_avx(auVar40,auVar36);
    auVar39 = vshufpd_avx(auVar31,auVar31,1);
    auVar31 = vminps_avx(auVar39,auVar31);
    auVar35 = vinsertps_avx(auVar35,auVar31,0x20);
    auVar39 = vmaxps_avx512vl(auVar33,auVar32);
    auVar31 = vshufpd_avx(auVar39,auVar39,1);
    auVar31 = vmaxps_avx(auVar31,auVar39);
    auVar38 = vmaxps_avx512vl(auVar34,auVar38);
    auVar39 = vshufpd_avx(auVar38,auVar38,1);
    auVar39 = vmaxps_avx(auVar39,auVar38);
    auVar31 = vinsertps_avx(auVar31,auVar39,0x1c);
    auVar39 = vmaxps_avx(auVar40,auVar36);
    auVar40 = vshufpd_avx(auVar39,auVar39,1);
    auVar39 = vmaxps_avx(auVar40,auVar39);
    auVar31 = vinsertps_avx(auVar31,auVar39,0x20);
    auVar18._8_4_ = 0x7fffffff;
    auVar18._0_8_ = 0x7fffffff7fffffff;
    auVar18._12_4_ = 0x7fffffff;
    auVar39 = vandps_avx512vl(auVar37,auVar18);
    auVar40 = vprolq_avx512vl(auVar39,0x20);
    auVar39 = vmaxps_avx(auVar40,auVar39);
    uVar66 = auVar39._0_4_;
    auVar71._4_4_ = uVar66;
    auVar71._0_4_ = uVar66;
    auVar71._8_4_ = uVar66;
    auVar71._12_4_ = uVar66;
    auVar39 = vshufps_avx(auVar39,auVar39,0xaa);
    auVar39 = vmaxps_avx(auVar39,auVar71);
    auVar35 = vminps_avx(auVar35,auVar69);
    auVar31 = vmaxps_avx(auVar31,auVar69);
    auVar19._8_4_ = 0x7fffffff;
    auVar19._0_8_ = 0x7fffffff7fffffff;
    auVar19._12_4_ = 0x7fffffff;
    auVar40 = vandps_avx512vl(auVar61,auVar19);
    auVar65 = vmaxps_avx(auVar39,auVar40);
    auVar35 = vsubps_avx(auVar35,auVar65);
  }
  else {
    if ((int)uVar5 < 0) {
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar35 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      auVar54 = ZEXT1632(auVar35);
      auVar56 = auVar55;
      auVar42 = auVar55;
      auVar52 = auVar57;
      auVar53 = auVar57;
    }
    else {
      auVar41 = vpbroadcastd_avx512vl();
      auVar82._8_4_ = 1;
      auVar82._0_8_ = 0x100000001;
      auVar82._12_4_ = 1;
      auVar82._16_4_ = 1;
      auVar82._20_4_ = 1;
      auVar82._24_4_ = 1;
      auVar82._28_4_ = 1;
      auVar60 = vpermps_avx2(auVar82,ZEXT1632(auVar39));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar43 = vpermps_avx512vl(auVar42,ZEXT1632(auVar39));
      auVar68._4_4_ = fVar12;
      auVar68._0_4_ = fVar12;
      auVar68._8_4_ = fVar12;
      auVar68._12_4_ = fVar12;
      auVar68._16_4_ = fVar12;
      auVar68._20_4_ = fVar12;
      auVar68._24_4_ = fVar12;
      auVar68._28_4_ = fVar12;
      auVar72._4_4_ = uVar83;
      auVar72._0_4_ = uVar83;
      auVar72._8_4_ = uVar83;
      auVar72._12_4_ = uVar83;
      auVar72._16_4_ = uVar83;
      auVar72._20_4_ = uVar83;
      auVar72._24_4_ = uVar83;
      auVar72._28_4_ = uVar83;
      auVar15 = vpermps_avx2(auVar82,ZEXT1632(auVar40));
      auVar44 = vpermps_avx512vl(auVar42,ZEXT1632(auVar40));
      auVar74._4_4_ = fVar13;
      auVar74._0_4_ = fVar13;
      auVar74._8_4_ = fVar13;
      auVar74._12_4_ = fVar13;
      auVar74._16_4_ = fVar13;
      auVar74._20_4_ = fVar13;
      auVar74._24_4_ = fVar13;
      auVar74._28_4_ = fVar13;
      auVar75._4_4_ = uVar77;
      auVar75._0_4_ = uVar77;
      auVar75._8_4_ = uVar77;
      auVar75._12_4_ = uVar77;
      auVar75._16_4_ = uVar77;
      auVar75._20_4_ = uVar77;
      auVar75._24_4_ = uVar77;
      auVar75._28_4_ = uVar77;
      auVar16 = vpermps_avx2(auVar82,ZEXT1632(auVar36));
      auVar45 = vpermps_avx512vl(auVar42,ZEXT1632(auVar36));
      auVar79._4_4_ = fVar14;
      auVar79._0_4_ = fVar14;
      auVar79._8_4_ = fVar14;
      auVar79._12_4_ = fVar14;
      auVar79._16_4_ = fVar14;
      auVar79._20_4_ = fVar14;
      auVar79._24_4_ = fVar14;
      auVar79._28_4_ = fVar14;
      uVar83 = auVar35._0_4_;
      auVar80._4_4_ = uVar83;
      auVar80._0_4_ = uVar83;
      auVar80._8_4_ = uVar83;
      auVar80._12_4_ = uVar83;
      auVar80._16_4_ = uVar83;
      auVar80._20_4_ = uVar83;
      auVar80._24_4_ = uVar83;
      auVar80._28_4_ = uVar83;
      auVar82 = vpermps_avx2(auVar82,ZEXT1632(auVar35));
      auVar46 = vpermps_avx512vl(auVar42,ZEXT1632(auVar35));
      auVar47 = vbroadcastss_avx512vl(auVar31);
      lVar28 = uVar26 * 0x44;
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar35 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar85 = ZEXT1664(auVar35);
      uVar27 = 0;
      auVar59 = auVar49;
      auVar21 = auVar48;
      auVar50 = auVar48;
      auVar51 = auVar49;
      do {
        auVar42 = vpbroadcastd_avx512vl();
        auVar52 = vpord_avx512vl(auVar42,_DAT_0205a920);
        auVar42 = *(undefined1 (*) [32])(catmullrom_basis0 + uVar27 * 4 + lVar28);
        auVar57 = *(undefined1 (*) [32])(lVar28 + 0x22307f0 + uVar27 * 4);
        auVar56 = *(undefined1 (*) [32])(lVar28 + 0x2230c74 + uVar27 * 4);
        uVar17 = vpcmpgtd_avx512vl(auVar52,auVar41);
        auVar52 = *(undefined1 (*) [32])(lVar28 + 0x22310f8 + uVar27 * 4);
        auVar53 = vmulps_avx512vl(auVar80,auVar52);
        auVar54 = vmulps_avx512vl(auVar82,auVar52);
        auVar55 = vmulps_avx512vl(auVar46,auVar52);
        auVar52 = vmulps_avx512vl(auVar47,auVar52);
        auVar53 = vfmadd231ps_avx512vl(auVar53,auVar56,auVar75);
        auVar54 = vfmadd231ps_avx512vl(auVar54,auVar56,auVar16);
        auVar55 = vfmadd231ps_avx512vl(auVar55,auVar56,auVar45);
        auVar56 = vfmadd231ps_avx512vl(auVar52,auVar79,auVar56);
        auVar52 = vfmadd231ps_avx512vl(auVar53,auVar57,auVar72);
        auVar53 = vfmadd231ps_avx512vl(auVar54,auVar57,auVar15);
        auVar54 = vfmadd231ps_avx512vl(auVar55,auVar57,auVar44);
        auVar57 = vfmadd231ps_avx512vl(auVar56,auVar74,auVar57);
        auVar58._4_4_ = uVar66;
        auVar58._0_4_ = uVar66;
        auVar58._8_4_ = uVar66;
        auVar58._12_4_ = uVar66;
        auVar58._16_4_ = uVar66;
        auVar58._20_4_ = uVar66;
        auVar58._24_4_ = uVar66;
        auVar58._28_4_ = uVar66;
        auVar56 = vfmadd231ps_avx512vl(auVar52,auVar42,auVar58);
        auVar55 = vfmadd231ps_avx512vl(auVar53,auVar42,auVar60);
        auVar54 = vfmadd231ps_avx512vl(auVar54,auVar42,auVar43);
        auVar58 = vfmadd231ps_avx512vl(auVar57,auVar68,auVar42);
        auVar20._8_4_ = 0x7fffffff;
        auVar20._0_8_ = 0x7fffffff7fffffff;
        auVar20._12_4_ = 0x7fffffff;
        auVar20._16_4_ = 0x7fffffff;
        auVar20._20_4_ = 0x7fffffff;
        auVar20._24_4_ = 0x7fffffff;
        auVar20._28_4_ = 0x7fffffff;
        vandps_avx512vl(auVar58,auVar20);
        auVar42 = vminps_avx512vl(auVar51,auVar56);
        bVar9 = (byte)uVar17;
        auVar52._0_4_ = (uint)(bVar9 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar42._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar52._4_4_ = (uint)bVar10 * auVar51._4_4_ | (uint)!bVar10 * auVar42._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar52._8_4_ = (uint)bVar10 * auVar51._8_4_ | (uint)!bVar10 * auVar42._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar52._12_4_ = (uint)bVar10 * auVar51._12_4_ | (uint)!bVar10 * auVar42._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar52._16_4_ = (uint)bVar10 * auVar51._16_4_ | (uint)!bVar10 * auVar42._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar52._20_4_ = (uint)bVar10 * auVar51._20_4_ | (uint)!bVar10 * auVar42._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar52._24_4_ = (uint)bVar10 * auVar51._24_4_ | (uint)!bVar10 * auVar42._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar52._28_4_ = (uint)bVar10 * auVar51._28_4_ | (uint)!bVar10 * auVar42._28_4_;
        auVar42 = vminps_avx512vl(auVar59,auVar55);
        auVar57._0_4_ = (uint)(bVar9 & 1) * auVar59._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar42._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar57._4_4_ = (uint)bVar10 * auVar59._4_4_ | (uint)!bVar10 * auVar42._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar57._8_4_ = (uint)bVar10 * auVar59._8_4_ | (uint)!bVar10 * auVar42._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar57._12_4_ = (uint)bVar10 * auVar59._12_4_ | (uint)!bVar10 * auVar42._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar57._16_4_ = (uint)bVar10 * auVar59._16_4_ | (uint)!bVar10 * auVar42._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar57._20_4_ = (uint)bVar10 * auVar59._20_4_ | (uint)!bVar10 * auVar42._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar57._24_4_ = (uint)bVar10 * auVar59._24_4_ | (uint)!bVar10 * auVar42._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar57._28_4_ = (uint)bVar10 * auVar59._28_4_ | (uint)!bVar10 * auVar42._28_4_;
        auVar42 = vminps_avx512vl(auVar49,auVar54);
        auVar53._0_4_ = (uint)(bVar9 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar42._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar53._4_4_ = (uint)bVar10 * auVar49._4_4_ | (uint)!bVar10 * auVar42._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar53._8_4_ = (uint)bVar10 * auVar49._8_4_ | (uint)!bVar10 * auVar42._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar53._12_4_ = (uint)bVar10 * auVar49._12_4_ | (uint)!bVar10 * auVar42._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar53._16_4_ = (uint)bVar10 * auVar49._16_4_ | (uint)!bVar10 * auVar42._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar53._20_4_ = (uint)bVar10 * auVar49._20_4_ | (uint)!bVar10 * auVar42._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar53._24_4_ = (uint)bVar10 * auVar49._24_4_ | (uint)!bVar10 * auVar42._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar53._28_4_ = (uint)bVar10 * auVar49._28_4_ | (uint)!bVar10 * auVar42._28_4_;
        auVar42 = vmaxps_avx512vl(auVar50,auVar56);
        auVar56._0_4_ = (uint)(bVar9 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar42._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar56._4_4_ = (uint)bVar10 * auVar50._4_4_ | (uint)!bVar10 * auVar42._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar56._8_4_ = (uint)bVar10 * auVar50._8_4_ | (uint)!bVar10 * auVar42._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar56._12_4_ = (uint)bVar10 * auVar50._12_4_ | (uint)!bVar10 * auVar42._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar56._16_4_ = (uint)bVar10 * auVar50._16_4_ | (uint)!bVar10 * auVar42._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar56._20_4_ = (uint)bVar10 * auVar50._20_4_ | (uint)!bVar10 * auVar42._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar56._24_4_ = (uint)bVar10 * auVar50._24_4_ | (uint)!bVar10 * auVar42._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar56._28_4_ = (uint)bVar10 * auVar50._28_4_ | (uint)!bVar10 * auVar42._28_4_;
        auVar55 = vmaxps_avx512vl(auVar21,auVar55);
        auVar42._0_4_ = (uint)(bVar9 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar55._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar42._4_4_ = (uint)bVar10 * auVar21._4_4_ | (uint)!bVar10 * auVar55._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar42._8_4_ = (uint)bVar10 * auVar21._8_4_ | (uint)!bVar10 * auVar55._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar42._12_4_ = (uint)bVar10 * auVar21._12_4_ | (uint)!bVar10 * auVar55._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar42._16_4_ = (uint)bVar10 * auVar21._16_4_ | (uint)!bVar10 * auVar55._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar42._20_4_ = (uint)bVar10 * auVar21._20_4_ | (uint)!bVar10 * auVar55._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar42._24_4_ = (uint)bVar10 * auVar21._24_4_ | (uint)!bVar10 * auVar55._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar42._28_4_ = (uint)bVar10 * auVar21._28_4_ | (uint)!bVar10 * auVar55._28_4_;
        auVar54 = vmaxps_avx512vl(auVar48,auVar54);
        auVar55._0_4_ = (uint)(bVar9 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar54._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar10 * auVar48._4_4_ | (uint)!bVar10 * auVar54._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar10 * auVar48._8_4_ | (uint)!bVar10 * auVar54._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar10 * auVar48._12_4_ | (uint)!bVar10 * auVar54._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar10 * auVar48._16_4_ | (uint)!bVar10 * auVar54._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar10 * auVar48._20_4_ | (uint)!bVar10 * auVar54._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar10 * auVar48._24_4_ | (uint)!bVar10 * auVar54._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar55._28_4_ = (uint)bVar10 * auVar48._28_4_ | (uint)!bVar10 * auVar54._28_4_;
        auVar59 = vmaxps_avx512vl(auVar85._0_32_,auVar58);
        auVar54._0_4_ = (uint)(bVar9 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar59._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar54._4_4_ = (uint)bVar10 * auVar85._4_4_ | (uint)!bVar10 * auVar59._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar54._8_4_ = (uint)bVar10 * auVar85._8_4_ | (uint)!bVar10 * auVar59._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar54._12_4_ = (uint)bVar10 * auVar85._12_4_ | (uint)!bVar10 * auVar59._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar54._16_4_ = (uint)bVar10 * auVar85._16_4_ | (uint)!bVar10 * auVar59._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar54._20_4_ = (uint)bVar10 * auVar85._20_4_ | (uint)!bVar10 * auVar59._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar54._24_4_ = (uint)bVar10 * auVar85._24_4_ | (uint)!bVar10 * auVar59._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar54._28_4_ = (uint)bVar10 * auVar85._28_4_ | (uint)!bVar10 * auVar59._28_4_;
        uVar27 = uVar27 + 8;
        auVar85 = ZEXT3264(auVar54);
        auVar49 = auVar53;
        auVar48 = auVar55;
        auVar59 = auVar57;
        auVar21 = auVar42;
        auVar50 = auVar56;
        auVar51 = auVar52;
      } while (uVar27 <= uVar26);
    }
    auVar60 = vshufps_avx512vl(auVar52,auVar52,0xb1);
    auVar60 = vminps_avx512vl(auVar52,auVar60);
    auVar52 = vshufpd_avx(auVar60,auVar60,5);
    auVar52 = vminps_avx(auVar60,auVar52);
    auVar35 = vminps_avx(auVar52._0_16_,auVar52._16_16_);
    auVar52 = vshufps_avx512vl(auVar57,auVar57,0xb1);
    auVar52 = vminps_avx512vl(auVar57,auVar52);
    auVar57 = vshufpd_avx(auVar52,auVar52,5);
    auVar57 = vminps_avx(auVar52,auVar57);
    auVar31 = vminps_avx(auVar57._0_16_,auVar57._16_16_);
    auVar31 = vunpcklps_avx(auVar35,auVar31);
    auVar57 = vshufps_avx512vl(auVar53,auVar53,0xb1);
    auVar52 = vminps_avx512vl(auVar53,auVar57);
    auVar57 = vshufpd_avx(auVar52,auVar52,5);
    auVar57 = vminps_avx(auVar52,auVar57);
    auVar35 = vminps_avx(auVar57._0_16_,auVar57._16_16_);
    auVar35 = vinsertps_avx(auVar31,auVar35,0x28);
    auVar57 = vshufps_avx512vl(auVar56,auVar56,0xb1);
    auVar56 = vmaxps_avx512vl(auVar56,auVar57);
    auVar57 = vshufpd_avx(auVar56,auVar56,5);
    auVar57 = vmaxps_avx(auVar56,auVar57);
    auVar31 = vmaxps_avx(auVar57._0_16_,auVar57._16_16_);
    auVar57 = vshufps_avx512vl(auVar42,auVar42,0xb1);
    auVar57 = vmaxps_avx512vl(auVar42,auVar57);
    auVar42 = vshufpd_avx(auVar57,auVar57,5);
    auVar42 = vmaxps_avx(auVar57,auVar42);
    auVar39 = vmaxps_avx(auVar42._0_16_,auVar42._16_16_);
    auVar39 = vunpcklps_avx(auVar31,auVar39);
    auVar42 = vshufps_avx512vl(auVar55,auVar55,0xb1);
    auVar57 = vmaxps_avx512vl(auVar55,auVar42);
    auVar42 = vshufpd_avx(auVar57,auVar57,5);
    auVar42 = vmaxps_avx(auVar57,auVar42);
    auVar31 = vmaxps_avx(auVar42._0_16_,auVar42._16_16_);
    auVar31 = vinsertps_avx(auVar39,auVar31,0x28);
    auVar42 = vshufps_avx512vl(auVar54,auVar54,0xb1);
    auVar57 = vmaxps_avx512vl(auVar54,auVar42);
    auVar42 = vshufpd_avx(auVar57,auVar57,5);
    auVar42 = vmaxps_avx(auVar57,auVar42);
    auVar39 = vmaxps_avx(auVar42._0_16_,auVar42._16_16_);
    auVar65._0_4_ = auVar39._0_4_;
    auVar65._4_4_ = auVar65._0_4_;
    auVar65._8_4_ = auVar65._0_4_;
    auVar65._12_4_ = auVar65._0_4_;
    auVar35 = vsubps_avx(auVar35,auVar65);
  }
  auVar62._0_4_ = auVar31._0_4_ + auVar65._0_4_;
  auVar62._4_4_ = auVar31._4_4_ + auVar65._4_4_;
  auVar62._8_4_ = auVar31._8_4_ + auVar65._8_4_;
  auVar62._12_4_ = auVar31._12_4_ + auVar65._12_4_;
  auVar63._8_4_ = 0x7fffffff;
  auVar63._0_8_ = 0x7fffffff7fffffff;
  auVar63._12_4_ = 0x7fffffff;
  auVar31 = vandps_avx(auVar35,auVar63);
  auVar39 = vandps_avx(auVar62,auVar63);
  auVar31 = vmaxps_avx(auVar31,auVar39);
  auVar39 = vmovshdup_avx(auVar31);
  auVar39 = vmaxss_avx(auVar39,auVar31);
  auVar31 = vshufpd_avx(auVar31,auVar31,1);
  auVar31 = vmaxss_avx(auVar31,auVar39);
  fVar1 = auVar31._0_4_ * 4.7683716e-07;
  auVar64._4_4_ = fVar1;
  auVar64._0_4_ = fVar1;
  auVar64._8_4_ = fVar1;
  auVar64._12_4_ = fVar1;
  aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar35,auVar64);
  (__return_storage_ptr__->lower).field_0 = aVar2;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar62._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar62._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar62._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar62._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }